

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

shared_ptr<CBlock> __thiscall
validation_block_tests::MinerTestingSetup::Block(MinerTestingSetup *this,uint256 *prev_hash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  Chainstate *chainstate;
  CScript *pCVar5;
  CBlockIndex *pCVar6;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  CChainParams *pCVar7;
  uint256 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar8;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar9;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> ptemplate;
  CMutableTransaction txCoinbase;
  Options options;
  unique_lock<std::recursive_mutex> local_58;
  undefined1 local_48 [24];
  pointer pCStack_30;
  pointer local_28;
  
  local_28 = *(pointer *)(in_FS_OFFSET + 0x28);
  if (Block(uint256_const&)::time == '\0') {
    iVar4 = __cxa_guard_acquire(&Block(uint256_const&)::time);
    if (iVar4 != 0) {
      pCVar7 = Params();
      Block::time = (uint64_t)(pCVar7->genesis).super_CBlockHeader.nTime;
      __cxa_guard_release(&Block(uint256_const&)::time);
    }
  }
  options.super_BlockCreateOptions.use_mempool = true;
  options.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  options.nBlockMaxWeight = 0x3cf960;
  options.blockMinFeeRate.nSatoshisPerK = 1000;
  options.test_block_validity = true;
  options.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         (*(ChainstateManager **)prev_hash[3].super_base_blob<256U>.m_data._M_elems)
  ;
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)&txCoinbase,chainstate,
             *(CTxMemPool **)prev_hash[2].super_base_blob<256U>.m_data._M_elems,&options);
  local_48._16_8_ = 0;
  pCStack_30 = (pointer)0x0;
  local_48._0_8_ = (char *)0x0;
  local_48._8_8_ = 0;
  lVar8 = (long)Block::i;
  Block::i = Block::i + 1;
  pCVar5 = CScript::push_int64((CScript *)local_48,lVar8);
  CScript::operator<<(pCVar5,OP_1);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&ptemplate,(CScript *)&txCoinbase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)&txCoinbase);
  std::make_shared<CBlock,CBlock&>((CBlock *)this);
  lVar8 = *(long *)&(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                    super_BasicTestingSetup.m_interrupt;
  uVar1 = *(undefined8 *)(in_RDX->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 8);
  uVar3 = *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)(lVar8 + 0x14) =
       *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)(lVar8 + 0x1c) = uVar3;
  *(undefined8 *)(lVar8 + 4) = uVar1;
  *(undefined8 *)(lVar8 + 0xc) = uVar2;
  Block::time = Block::time + 1;
  *(int *)(lVar8 + 0x44) = (int)Block::time;
  CMutableTransaction::CMutableTransaction
            (&txCoinbase,(CTransaction *)**(undefined8 **)(lVar8 + 0x50));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txCoinbase.vout,2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &P2WSH_OP_TRUE.super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[1].nValue =
       (txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start)->nValue;
  (txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0;
  CScriptWitness::SetNull
            (&(txCoinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptWitness);
  local_48._16_8_ = 0;
  pCStack_30 = (pointer)0x0;
  local_48._0_8_ = (char *)0x0;
  local_48._8_8_ = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0x54,false);
  pCVar6 = ::node::BlockManager::LookupBlockIndex
                     ((BlockManager *)
                      (*(long *)prev_hash[3].super_base_blob<256U>.m_data._M_elems + 0x800),in_RDX);
  iVar4 = pCVar6->nHeight;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_58);
  pCVar5 = CScript::push_int64((CScript *)local_48,(long)iVar4 + 1);
  other = &CScript::operator<<(pCVar5,OP_0)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txCoinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_48);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (*(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)
              (*(long *)&(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                         super_BasicTestingSetup.m_interrupt + 0x50),
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  CMutableTransaction::~CMutableTransaction(&txCoinbase);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&ptemplate);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_28) {
    sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<CBlock>)sVar9.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CBlock> MinerTestingSetup::Block(const uint256& prev_hash)
{
    static int i = 0;
    static uint64_t time = Params().GenesisBlock().nTime;

    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(CScript{} << i++ << OP_TRUE);
    auto pblock = std::make_shared<CBlock>(ptemplate->block);
    pblock->hashPrevBlock = prev_hash;
    pblock->nTime = ++time;

    // Make the coinbase transaction with two outputs:
    // One zero-value one that has a unique pubkey to make sure that blocks at the same height can have a different hash
    // Another one that has the coinbase reward in a P2WSH with OP_TRUE as witness program to make it easy to spend
    CMutableTransaction txCoinbase(*pblock->vtx[0]);
    txCoinbase.vout.resize(2);
    txCoinbase.vout[1].scriptPubKey = P2WSH_OP_TRUE;
    txCoinbase.vout[1].nValue = txCoinbase.vout[0].nValue;
    txCoinbase.vout[0].nValue = 0;
    txCoinbase.vin[0].scriptWitness.SetNull();
    // Always pad with OP_0 at the end to avoid bad-cb-length error
    txCoinbase.vin[0].scriptSig = CScript{} << WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(prev_hash)->nHeight + 1) << OP_0;
    pblock->vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    return pblock;
}